

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient4dexact(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int elen;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined4 uVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double temp48b [48];
  double temp48a [48];
  double eac [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  double temp8b [8];
  double temp8a [8];
  double deb [24];
  double temp16 [16];
  double ddet [192];
  double cdet [192];
  double bdet [192];
  double adet [192];
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  double edet [192];
  double cddet [384];
  double abdet [384];
  double deter [960];
  double cdedet [576];
  double dStack_8360;
  double dStack_8330;
  double dStack_8310;
  double dStack_8260;
  double dStack_8220;
  double local_81f8;
  double dStack_81f0;
  double local_81e8;
  double local_81e0;
  double local_81d8;
  double dStack_81d0;
  double local_81c8;
  double local_81c0;
  undefined1 local_81b8 [16];
  double local_81a8;
  double local_81a0;
  double local_8198;
  double dStack_8190;
  double local_8188;
  double local_8180;
  double local_8178;
  double dStack_8170;
  double local_8168;
  double local_8160;
  double local_8158;
  double dStack_8150;
  double local_8148;
  double local_8140;
  undefined1 local_8138 [16];
  double local_8128;
  double local_8120;
  double local_8118;
  double dStack_8110;
  double local_8108;
  double local_8100;
  double local_80f8;
  double dStack_80f0;
  double local_80e8;
  double local_80e0;
  double local_80d8;
  double dStack_80d0;
  double local_80c8;
  double local_80c0;
  double local_80b8 [48];
  double local_7f38 [48];
  double local_7db8 [24];
  double local_7cf8 [24];
  double local_7c38 [24];
  double local_7b78 [24];
  double local_7ab8 [24];
  double local_79f8 [24];
  double local_7938 [24];
  double local_7878 [24];
  double local_77b8 [24];
  double local_76f8 [8];
  double local_76b8 [8];
  double local_7678 [24];
  double local_75b8 [16];
  double local_7538 [192];
  double local_6f38 [192];
  double local_6938 [192];
  double local_6338 [192];
  double local_5d38 [96];
  double local_5a38 [96];
  double local_5738 [96];
  double local_5438 [96];
  double local_5138 [96];
  double local_4e38 [192];
  double local_4838 [384];
  double local_3c38 [383];
  double adStack_3040 [961];
  double local_1238 [577];
  
  dVar23 = *pb;
  dVar21 = pb[1];
  dVar58 = *pa;
  dVar56 = pa[1];
  dVar26 = dVar21 * dVar58;
  dVar38 = dVar23 * dVar56;
  dVar24 = splitter * dVar21 - (splitter * dVar21 - dVar21);
  dVar28 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar25 = splitter * dVar58 - (splitter * dVar58 - dVar58);
  dVar29 = splitter * dVar56 - (splitter * dVar56 - dVar56);
  dVar30 = dVar21 - dVar24;
  dVar35 = dVar23 - dVar28;
  dVar45 = dVar58 - dVar25;
  dVar46 = dVar56 - dVar29;
  dVar31 = dVar30 * dVar45 - (((dVar26 - dVar25 * dVar24) - dVar45 * dVar24) - dVar30 * dVar25);
  dVar36 = dVar35 * dVar46 - (((dVar38 - dVar28 * dVar29) - dVar35 * dVar29) - dVar46 * dVar28);
  dVar40 = dVar31 - dVar36;
  dVar20 = dVar26 + dVar40;
  dVar26 = (dVar26 - (dVar20 - (dVar20 - dVar26))) + (dVar40 - (dVar20 - dVar26));
  dVar27 = dVar26 - dVar38;
  dVar26 = (dVar26 - (dVar27 + (dVar26 - dVar27))) + ((dVar26 - dVar27) - dVar38);
  local_81b8._8_4_ = SUB84(dVar26,0);
  local_81b8._0_8_ = (dVar31 - (dVar40 + (dVar31 - dVar40))) + ((dVar31 - dVar40) - dVar36);
  local_81b8._12_4_ = (int)((ulong)dVar26 >> 0x20);
  local_81a0 = dVar20 + dVar27;
  local_81a8 = (dVar20 - (local_81a0 - (local_81a0 - dVar20))) + (dVar27 - (local_81a0 - dVar20));
  dVar62 = *pc;
  dVar61 = pc[1];
  dVar27 = splitter * dVar62 - (splitter * dVar62 - dVar62);
  dVar22 = splitter * dVar61 - (splitter * dVar61 - dVar61);
  dVar39 = *pd;
  dVar34 = pd[1];
  dVar53 = splitter * dVar34 - (splitter * dVar34 - dVar34);
  dVar54 = splitter * dVar39 - (splitter * dVar39 - dVar39);
  dVar25 = -dVar25;
  dVar28 = -dVar28;
  dVar31 = -dVar27;
  auVar6._8_4_ = SUB84(dVar54,0);
  auVar6._0_8_ = dVar31;
  auVar6._12_4_ = (uint)((ulong)dVar54 >> 0x20) ^ 0x80000000;
  dVar36 = dVar62 - dVar27;
  dVar40 = dVar61 - dVar22;
  uVar44 = (undefined4)((ulong)dVar40 >> 0x20);
  dVar32 = dVar34 - dVar53;
  dVar37 = dVar39 - dVar54;
  dVar26 = -dVar45;
  auVar1._8_4_ = SUB84(dVar35,0);
  auVar1._0_8_ = dVar26;
  auVar1._12_4_ = (int)((ulong)-dVar35 >> 0x20);
  dVar55 = -dVar36;
  dVar57 = -dVar37;
  dVar33 = dVar21 * dVar62;
  dVar38 = dVar23 * dVar61;
  dStack_8310 = auVar6._8_8_;
  auVar3._8_4_ = SUB84(dVar40,0);
  auVar3._0_8_ = dVar36;
  auVar3._12_4_ = uVar44;
  dVar51 = dVar30 * dVar36 - (dVar31 * dVar30 + dVar55 * dVar24 + dVar31 * dVar24 + dVar33);
  dVar52 = dVar35 * dVar40 - (dVar40 * dVar28 + dVar22 * -dVar35 + dVar22 * dVar28 + dVar38);
  dVar48 = dVar52 - dVar51;
  dVar41 = dVar38 + dVar48;
  dVar38 = (dVar38 - (dVar41 - (dVar41 - dVar38))) + (dVar48 - (dVar41 - dVar38));
  dVar20 = dVar38 - dVar33;
  local_80d8 = (dVar52 - (dVar48 + (dVar52 - dVar48))) + ((dVar52 - dVar48) - dVar51);
  dStack_80d0 = (dVar38 - ((dVar38 - dVar20) + dVar20)) + ((dVar38 - dVar20) - dVar33);
  local_80c0 = dVar41 + dVar20;
  local_80c8 = (dVar41 - (local_80c0 - (local_80c0 - dVar41))) + (dVar20 - (local_80c0 - dVar41));
  dVar20 = dVar62 * dVar34;
  dVar51 = dVar61 * dVar39;
  dVar33 = dVar36 * dVar32 - (((dVar20 - dVar27 * dVar53) - dVar53 * dVar36) - dVar32 * dVar27);
  dVar41 = dVar40 * dVar37 - (((dVar51 - dVar54 * dVar22) - dVar22 * dVar37) - dVar40 * dVar54);
  dVar48 = dVar33 - dVar41;
  dVar38 = dVar20 + dVar48;
  dVar20 = (dVar20 - (dVar38 - (dVar38 - dVar20))) + (dVar48 - (dVar38 - dVar20));
  dVar27 = dVar20 - dVar51;
  local_8118 = (dVar33 - (dVar48 + (dVar33 - dVar48))) + ((dVar33 - dVar48) - dVar41);
  dStack_8110 = (dVar20 - (dVar27 + (dVar20 - dVar27))) + ((dVar20 - dVar27) - dVar51);
  local_8100 = dVar38 + dVar27;
  local_8108 = (dVar38 - (local_8100 - (local_8100 - dVar38))) + (dVar27 - (local_8100 - dVar38));
  dVar33 = *pe;
  dVar41 = pe[1];
  dVar38 = splitter * dVar33 - (splitter * dVar33 - dVar33);
  dVar47 = splitter * dVar41 - (splitter * dVar41 - dVar41);
  dVar42 = -dVar38;
  dVar60 = dVar34 * dVar33;
  dVar20 = dVar39 * dVar41;
  dVar49 = dVar41 * dVar62;
  dVar50 = dVar33 * dVar61;
  dVar61 = dVar61 * dVar58;
  dVar62 = dVar62 * dVar56;
  dVar48 = dVar23 * dVar34;
  dVar52 = dVar21 * dVar39;
  dVar34 = dVar34 * dVar58;
  dVar39 = dVar39 * dVar56;
  dVar56 = dVar56 * dVar33;
  dVar58 = dVar58 * dVar41;
  dVar21 = dVar21 * dVar33;
  dVar23 = dVar23 * dVar41;
  dVar33 = dVar33 - dVar38;
  dVar41 = dVar41 - dVar47;
  dVar59 = -dVar33;
  dVar51 = dVar32 * dVar33 - (dVar42 * dVar32 + dVar59 * dVar53 + dVar42 * dVar53 + dVar60);
  dVar54 = dVar37 * dVar41 -
           (dVar41 * dStack_8310 + dVar47 * dVar57 + dVar47 * dStack_8310 + dVar20);
  dVar43 = dVar54 - dVar51;
  dVar27 = dVar20 + dVar43;
  dVar38 = (dVar20 - (dVar27 - (dVar27 - dVar20))) + (dVar43 - (dVar27 - dVar20));
  dVar20 = dVar38 - dVar60;
  dVar38 = (dVar38 - ((dVar38 - dVar20) + dVar20)) + ((dVar38 - dVar20) - dVar60);
  local_8138._8_4_ = SUB84(dVar38,0);
  local_8138._0_8_ = (dVar54 - (dVar43 + (dVar54 - dVar43))) + ((dVar54 - dVar43) - dVar51);
  local_8138._12_4_ = (int)((ulong)dVar38 >> 0x20);
  local_8120 = dVar27 + dVar20;
  local_8128 = (dVar27 - (local_8120 - (local_8120 - dVar27))) + (dVar20 - (local_8120 - dVar27));
  auVar4._8_4_ = SUB84(dVar29,0);
  auVar4._0_8_ = dVar53;
  auVar4._12_4_ = (int)((ulong)dVar29 >> 0x20);
  dStack_8220 = auVar1._8_8_;
  dVar54 = auVar3._8_8_;
  auVar2._8_4_ = SUB84(dVar40,0);
  auVar2._0_8_ = dVar41;
  auVar2._12_4_ = uVar44;
  auVar5._8_4_ = SUB84(dVar37 * dVar46,0);
  auVar5._0_8_ = dVar32 * dVar45;
  auVar5._12_4_ = (int)((ulong)(dVar37 * dVar46) >> 0x20);
  dVar38 = dVar46 * dVar33 - (dVar46 * dVar42 + dVar59 * dVar29 + dVar42 * dVar29 + dVar56);
  dVar20 = dVar45 * dVar41 - (dVar41 * dVar25 + dVar26 * dVar47 + dVar25 * dVar47 + dVar58);
  dVar27 = dVar38 - dVar20;
  dVar40 = dVar56 + dVar27;
  dVar56 = (dVar56 - (dVar40 - (dVar40 - dVar56))) + (dVar27 - (dVar40 - dVar56));
  dVar51 = dVar56 - dVar58;
  local_8158 = (dVar38 - (dVar27 + (dVar38 - dVar27))) + ((dVar38 - dVar27) - dVar20);
  dStack_8150 = (dVar56 - (dVar51 + (dVar56 - dVar51))) + ((dVar56 - dVar51) - dVar58);
  local_8140 = dVar40 + dVar51;
  local_8148 = (dVar40 - (local_8140 - (local_8140 - dVar40))) + (dVar51 - (local_8140 - dVar40));
  dVar58 = dVar54 * dVar45 - (dVar54 * dVar25 + dVar26 * dVar22 + dVar25 * dVar22 + dVar61);
  dVar56 = dVar36 * dVar46 - (dVar46 * dVar31 + dVar55 * dVar29 + dVar31 * dVar29 + dVar62);
  dVar20 = dVar58 - dVar56;
  dVar38 = dVar61 + dVar20;
  dVar27 = (dVar61 - (dVar38 - (dVar38 - dVar61))) + (dVar20 - (dVar38 - dVar61));
  dVar40 = dVar27 - dVar62;
  local_80f8 = (dVar58 - (dVar20 + (dVar58 - dVar20))) + ((dVar58 - dVar20) - dVar56);
  dStack_80f0 = (dVar27 - (dVar40 + (dVar27 - dVar40))) + ((dVar27 - dVar40) - dVar62);
  local_80e0 = dVar38 + dVar40;
  local_80e8 = (dVar38 - (local_80e0 - (local_80e0 - dVar38))) + (dVar40 - (local_80e0 - dVar38));
  dVar58 = dVar35 * dVar32 - (dVar32 * dVar28 + dStack_8220 * dVar53 + dVar28 * dVar53 + dVar48);
  dVar56 = dVar30 * dVar37 -
           (dVar30 * dStack_8310 + dVar57 * dVar24 + dStack_8310 * dVar24 + dVar52);
  dVar20 = dVar58 - dVar56;
  dVar38 = dVar48 + dVar20;
  dVar27 = (dVar48 - (dVar38 - (dVar38 - dVar48))) + (dVar20 - (dVar38 - dVar48));
  dVar40 = dVar27 - dVar52;
  local_81d8 = (dVar58 - (dVar20 + (dVar58 - dVar20))) + ((dVar58 - dVar20) - dVar56);
  dStack_81d0 = (dVar27 - (dVar40 + (dVar27 - dVar40))) + ((dVar27 - dVar40) - dVar52);
  local_81c0 = dVar38 + dVar40;
  local_81c8 = (dVar38 - (local_81c0 - (local_81c0 - dVar38))) + (dVar40 - (local_81c0 - dVar38));
  dStack_8260 = auVar2._8_8_;
  dVar36 = dVar41 * dVar36 - (dVar41 * dVar31 + dVar55 * dVar47 + dVar31 * dVar47 + dVar49);
  dVar40 = dVar33 * dVar54 - (dStack_8260 * dVar42 + dVar59 * dVar22 + dVar42 * dVar22 + dVar50);
  dVar20 = dVar36 - dVar40;
  dVar38 = dVar49 + dVar20;
  dVar27 = (dVar49 - (dVar38 - (dVar38 - dVar49))) + (dVar20 - (dVar38 - dVar49));
  dVar31 = dVar27 - dVar50;
  local_81f8 = (dVar36 - (dVar20 + (dVar36 - dVar20))) + ((dVar36 - dVar20) - dVar40);
  dStack_81f0 = (dVar27 - (dVar31 + (dVar27 - dVar31))) + ((dVar27 - dVar31) - dVar50);
  local_81e0 = dVar38 + dVar31;
  local_81e8 = (dVar38 - (local_81e0 - (local_81e0 - dVar38))) + (dVar31 - (local_81e0 - dVar38));
  dStack_8330 = auVar4._8_8_;
  dStack_8360 = auVar5._8_8_;
  dVar26 = dVar32 * dVar45 - (dVar32 * dVar25 + dVar26 * dVar53 + dVar25 * dVar53 + dVar34);
  dStack_8360 = dStack_8360 -
                (dVar46 * dStack_8310 + dVar57 * dStack_8330 + dStack_8310 * dStack_8330 + dVar39);
  dVar31 = dStack_8360 - dVar26;
  dVar27 = dVar39 + dVar31;
  dVar38 = (dVar39 - (dVar27 - (dVar27 - dVar39))) + (dVar31 - (dVar27 - dVar39));
  dVar20 = dVar38 - dVar34;
  local_8178 = (dStack_8360 - (dVar31 + (dStack_8360 - dVar31))) + ((dStack_8360 - dVar31) - dVar26)
  ;
  dStack_8170 = (dVar38 - ((dVar38 - dVar20) + dVar20)) + ((dVar38 - dVar20) - dVar34);
  local_8160 = dVar27 + dVar20;
  local_8168 = (dVar27 - (local_8160 - (local_8160 - dVar27))) + (dVar20 - (local_8160 - dVar27));
  dVar31 = dVar33 * dVar30 - (dVar30 * dVar42 + dVar59 * dVar24 + dVar42 * dVar24 + dVar21);
  dVar36 = dVar41 * dVar35 - (dVar41 * dVar28 + dStack_8220 * dVar47 + dVar28 * dVar47 + dVar23);
  dVar27 = dVar31 - dVar36;
  dVar26 = dVar21 + dVar27;
  dVar38 = (dVar21 - (dVar26 - (dVar26 - dVar21))) + (dVar27 - (dVar26 - dVar21));
  dVar20 = dVar38 - dVar23;
  local_8198 = (dVar31 - (dVar27 + (dVar31 - dVar27))) + ((dVar31 - dVar27) - dVar36);
  dStack_8190 = (dVar38 - (dVar20 + (dVar38 - dVar20))) + ((dVar38 - dVar20) - dVar23);
  local_8180 = dVar26 + dVar20;
  local_8188 = (dVar26 - (local_8180 - (local_8180 - dVar26))) + (dVar20 - (local_8180 - dVar26));
  dVar26 = pa[2];
  iVar7 = scale_expansion_zeroelim(4,&local_80d8,dVar26,local_76b8);
  dVar38 = pb[2];
  iVar8 = scale_expansion_zeroelim(4,&local_80f8,-dVar38,local_76f8);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_76b8,iVar8,local_76f8,local_75b8);
  dVar20 = pc[2];
  iVar8 = scale_expansion_zeroelim(4,(double *)local_81b8,dVar20,local_76b8);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,local_76b8,iVar7,local_75b8,local_77b8);
  iVar8 = scale_expansion_zeroelim(4,&local_8118,dVar38,local_76b8);
  iVar9 = scale_expansion_zeroelim(4,&local_81d8,-dVar20,local_76f8);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_76b8,iVar9,local_76f8,local_75b8);
  dVar27 = pd[2];
  iVar9 = scale_expansion_zeroelim(4,&local_80d8,dVar27,local_76b8);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,local_76b8,iVar8,local_75b8,local_7878);
  iVar9 = scale_expansion_zeroelim(4,(double *)local_8138,dVar20,local_76b8);
  iVar10 = scale_expansion_zeroelim(4,&local_81f8,-dVar27,local_76f8);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,local_76b8,iVar10,local_76f8,local_75b8);
  dVar31 = pe[2];
  iVar10 = scale_expansion_zeroelim(4,&local_8118,dVar31,local_76b8);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,local_76b8,iVar9,local_75b8,local_7938);
  iVar10 = scale_expansion_zeroelim(4,&local_8158,dVar27,local_76b8);
  iVar11 = scale_expansion_zeroelim(4,&local_8178,-dVar31,local_76f8);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,local_76b8,iVar11,local_76f8,local_75b8);
  iVar11 = scale_expansion_zeroelim(4,(double *)local_8138,dVar26,local_76b8);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,local_76b8,iVar10,local_75b8,local_79f8);
  iVar11 = scale_expansion_zeroelim(4,(double *)local_81b8,dVar31,local_76b8);
  iVar12 = scale_expansion_zeroelim(4,&local_8198,-dVar26,local_76f8);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,local_76b8,iVar12,local_76f8,local_75b8);
  iVar12 = scale_expansion_zeroelim(4,&local_8158,dVar38,local_76b8);
  iVar11 = fast_expansion_sum_zeroelim(iVar12,local_76b8,iVar11,local_75b8,local_7ab8);
  iVar12 = scale_expansion_zeroelim(4,&local_81d8,dVar26,local_76b8);
  iVar13 = scale_expansion_zeroelim(4,&local_8178,dVar38,local_76f8);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,local_76b8,iVar13,local_76f8,local_75b8);
  iVar13 = scale_expansion_zeroelim(4,(double *)local_81b8,dVar27,local_76b8);
  iVar12 = fast_expansion_sum_zeroelim(iVar13,local_76b8,iVar12,local_75b8,local_7b78);
  iVar13 = scale_expansion_zeroelim(4,&local_81f8,dVar38,local_76b8);
  iVar14 = scale_expansion_zeroelim(4,&local_8198,dVar20,local_76f8);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,local_76b8,iVar14,local_76f8,local_75b8);
  iVar14 = scale_expansion_zeroelim(4,&local_80d8,dVar31,local_76b8);
  iVar13 = fast_expansion_sum_zeroelim(iVar14,local_76b8,iVar13,local_75b8,local_7c38);
  iVar14 = scale_expansion_zeroelim(4,&local_8178,dVar20,local_76b8);
  iVar15 = scale_expansion_zeroelim(4,&local_80f8,dVar27,local_76f8);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,local_76b8,iVar15,local_76f8,local_75b8);
  iVar15 = scale_expansion_zeroelim(4,&local_8118,dVar26,local_76b8);
  iVar14 = fast_expansion_sum_zeroelim(iVar15,local_76b8,iVar14,local_75b8,local_7cf8);
  iVar15 = scale_expansion_zeroelim(4,&local_8198,dVar27,local_76b8);
  iVar16 = scale_expansion_zeroelim(4,&local_81d8,dVar31,local_76f8);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,local_76b8,iVar16,local_76f8,local_75b8);
  iVar16 = scale_expansion_zeroelim(4,(double *)local_8138,dVar38,local_76b8);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,local_76b8,iVar15,local_75b8,local_7678);
  iVar16 = scale_expansion_zeroelim(4,&local_80f8,dVar31,local_76b8);
  iVar17 = scale_expansion_zeroelim(4,&local_81f8,dVar26,local_76f8);
  iVar16 = fast_expansion_sum_zeroelim(iVar16,local_76b8,iVar17,local_76f8,local_75b8);
  iVar17 = scale_expansion_zeroelim(4,&local_8158,dVar20,local_76b8);
  iVar16 = fast_expansion_sum_zeroelim(iVar17,local_76b8,iVar16,local_75b8,local_7db8);
  iVar17 = fast_expansion_sum_zeroelim(iVar9,local_7938,iVar13,local_7c38,local_7f38);
  uVar18 = fast_expansion_sum_zeroelim(iVar15,local_7678,iVar8,local_7878,local_80b8);
  if (0 < (int)uVar18) {
    uVar19 = 0;
    do {
      local_80b8[uVar19] = -local_80b8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  iVar17 = fast_expansion_sum_zeroelim(iVar17,local_7f38,uVar18,local_80b8,local_5438);
  iVar17 = scale_expansion_zeroelim(iVar17,local_5438,aheight,local_6338);
  elen = fast_expansion_sum_zeroelim(iVar10,local_79f8,iVar14,local_7cf8,local_7f38);
  uVar18 = fast_expansion_sum_zeroelim(iVar16,local_7db8,iVar9,local_7938,local_80b8);
  if (0 < (int)uVar18) {
    uVar19 = 0;
    do {
      local_80b8[uVar19] = -local_80b8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  iVar9 = fast_expansion_sum_zeroelim(elen,local_7f38,uVar18,local_80b8,local_5738);
  iVar9 = scale_expansion_zeroelim(iVar9,local_5738,bheight,local_6938);
  iVar15 = fast_expansion_sum_zeroelim(iVar11,local_7ab8,iVar15,local_7678,local_7f38);
  uVar18 = fast_expansion_sum_zeroelim(iVar12,local_7b78,iVar10,local_79f8,local_80b8);
  if (0 < (int)uVar18) {
    uVar19 = 0;
    do {
      local_80b8[uVar19] = -local_80b8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  iVar10 = fast_expansion_sum_zeroelim(iVar15,local_7f38,uVar18,local_80b8,local_5a38);
  iVar10 = scale_expansion_zeroelim(iVar10,local_5a38,cheight,local_6f38);
  iVar15 = fast_expansion_sum_zeroelim(iVar7,local_77b8,iVar16,local_7db8,local_7f38);
  uVar18 = fast_expansion_sum_zeroelim(iVar13,local_7c38,iVar11,local_7ab8,local_80b8);
  if (0 < (int)uVar18) {
    uVar19 = 0;
    do {
      local_80b8[uVar19] = -local_80b8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  iVar11 = fast_expansion_sum_zeroelim(iVar15,local_7f38,uVar18,local_80b8,local_5d38);
  iVar11 = scale_expansion_zeroelim(iVar11,local_5d38,dheight,local_7538);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_7878,iVar12,local_7b78,local_7f38);
  uVar18 = fast_expansion_sum_zeroelim(iVar14,local_7cf8,iVar7,local_77b8,local_80b8);
  if (0 < (int)uVar18) {
    uVar19 = 0;
    do {
      local_80b8[uVar19] = -local_80b8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  iVar7 = fast_expansion_sum_zeroelim(iVar8,local_7f38,uVar18,local_80b8,local_5138);
  iVar7 = scale_expansion_zeroelim(iVar7,local_5138,eheight,local_4e38);
  iVar8 = fast_expansion_sum_zeroelim(iVar17,local_6338,iVar9,local_6938,local_3c38);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,local_6f38,iVar11,local_7538,local_4838);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,local_4838,iVar7,local_4e38,local_1238);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,local_3c38,iVar7,local_1238,adStack_3040 + 1);
  return adStack_3040[iVar7];
}

Assistant:

REAL orient4dexact(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL adet[192], bdet[192], cdet[192], ddet[192], edet[192];
  int alen, blen, clen, dlen, elen;
  REAL abdet[384], cddet[384], cdedet[576];
  int ablen, cdlen;
  REAL deter[960];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  alen = scale_expansion_zeroelim(bcdelen, bcde, aheight, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  blen = scale_expansion_zeroelim(cdealen, cdea, bheight, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  clen = scale_expansion_zeroelim(deablen, deab, cheight, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  dlen = scale_expansion_zeroelim(eabclen, eabc, dheight, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  elen = scale_expansion_zeroelim(abcdlen, abcd, eheight, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}